

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

Result * cfWriteconfig(Result *__return_storage_ptr__,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      params)

{
  undefined1 local_270 [8];
  ofstream file;
  Color local_70;
  string local_60;
  allocator local_39;
  undefined1 local_38 [8];
  Writer writer;
  Node node;
  
  Jzon::object();
  std::__cxx11::string::string((string *)local_270,"width",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,(int)size.x);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"height",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,(int)size.y);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"bpp",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,bitsPerPixel);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"fullscreen",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,enableFullscreen);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"autoresolution",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,autoResolution);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"vsync",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,enableVSync);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"borderless",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,enableBorderless);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"resizeable",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,enableResizable);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::string((string *)local_270,"targetexcess",(allocator *)&local_60);
  Jzon::Node::Node((Node *)local_38,targetExcess);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_38);
  Jzon::Node::~Node((Node *)local_38);
  std::__cxx11::string::~string((string *)local_270);
  Jzon::Writer::Writer((Writer *)local_38,(Format *)&Jzon::NoFormat);
  std::ofstream::ofstream(local_270,"data/config.json",_S_out);
  Jzon::Writer::writeStream((Writer *)local_38,(Node *)&writer.spacing,(ostream *)local_270);
  std::__cxx11::string::string((string *)&local_60,"wrote data/config.json",&local_39);
  nite::Color::Color(&local_70,1.0,1.0,1.0,1.0);
  nite::Console::Result::Result(__return_storage_ptr__,&local_60,&local_70);
  std::__cxx11::string::~string((string *)&local_60);
  std::ofstream::~ofstream(local_270);
  Jzon::Writer::~Writer((Writer *)local_38);
  Jzon::Node::~Node((Node *)&writer.spacing);
  return __return_storage_ptr__;
}

Assistant:

static nite::Console::Result cfWriteconfig(Vector<String> params){
	return writeConfigFile();
}